

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::SetItemOnTaggedNumber
               (Var receiver,RecyclableObject *object,uint32 index,Var newValue,
               ScriptContext *requestContext,PropertyOperationFlags propertyOperationFlags)

{
  code *pcVar1;
  PropertyRecord *this;
  RecyclableObject *receiver_00;
  bool bVar2;
  SideEffects SVar3;
  BOOL BVar4;
  PropertyId propertyId;
  undefined4 *puVar5;
  PropertyRecord *local_68;
  PropertyRecord *propertyRecord;
  JavascriptProxy *proxy;
  RecyclableObject *func;
  Var pvStack_48;
  DescriptorFlags flags;
  Var setterValueOrProxy;
  ScriptContext *pSStack_38;
  PropertyOperationFlags propertyOperationFlags_local;
  ScriptContext *requestContext_local;
  Var newValue_local;
  RecyclableObject *pRStack_20;
  uint32 index_local;
  RecyclableObject *object_local;
  Var receiver_local;
  
  setterValueOrProxy._4_4_ = propertyOperationFlags;
  pSStack_38 = requestContext;
  requestContext_local = (ScriptContext *)newValue;
  newValue_local._4_4_ = index;
  pRStack_20 = object;
  object_local = (RecyclableObject *)receiver;
  bVar2 = TaggedNumber::Is(receiver);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0xa0d,"(TaggedNumber::Is(receiver))","TaggedNumber::Is(receiver)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  SVar3 = ScriptContextOptimizationOverrideInfo::GetSideEffects(&pSStack_38->optimizationOverrides);
  if ((SVar3 & SideEffects_Accessor) != SideEffects_None) {
    pvStack_48 = (Var)0x0;
    func._4_4_ = 0;
    if (pRStack_20 == (RecyclableObject *)0x0) {
      GetPropertyObject(object_local,pSStack_38,&stack0xffffffffffffffe0);
    }
    BVar4 = CheckPrototypesForAccessorOrNonWritableItem
                      (pRStack_20,newValue_local._4_4_,&stack0xffffffffffffffb8,
                       (DescriptorFlags *)((long)&func + 4),pSStack_38,0);
    if (BVar4 != 0) {
      if ((func._4_4_ & 1) == 1) {
        bVar2 = JavascriptError::ThrowIfStrictModeUndefinedSetter
                          (setterValueOrProxy._4_4_,pvStack_48,pSStack_38);
        if (bVar2) {
          return 1;
        }
        if (pvStack_48 != (Var)0x0) {
          proxy = (JavascriptProxy *)VarTo<Js::RecyclableObject>(pvStack_48);
          CallSetter((RecyclableObject *)proxy,object_local,requestContext_local,pSStack_38);
          return 1;
        }
      }
      else {
        if ((func._4_4_ & 0x10) == 0x10) {
          bVar2 = VarIs<Js::JavascriptProxy>(pvStack_48);
          if (!bVar2) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                        ,0xa28,"(VarIs<JavascriptProxy>(setterValueOrProxy))",
                                        "VarIs<JavascriptProxy>(setterValueOrProxy)");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
          propertyRecord = (PropertyRecord *)VarTo<Js::JavascriptProxy>(pvStack_48);
          local_68 = (PropertyRecord *)0x0;
          Js::JavascriptProxy::PropertyIdFromInt
                    ((JavascriptProxy *)propertyRecord,newValue_local._4_4_,&local_68);
          receiver_00 = object_local;
          this = propertyRecord;
          propertyId = PropertyRecord::GetPropertyId(local_68);
          BVar4 = Js::JavascriptProxy::SetPropertyTrap
                            ((JavascriptProxy *)this,receiver_00,SetItemOnTaggedNumberKind,
                             propertyId,requestContext_local,pSStack_38,setterValueOrProxy._4_4_,0);
          return BVar4;
        }
        if (((func._4_4_ & 2) != 2) || ((func._4_4_ & 4) != 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0xa30,
                                      "((flags & Data) == Data && (flags & Writable) == None)",
                                      "(flags & Data) == Data && (flags & Writable) == None");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        JavascriptError::ThrowCantAssignIfStrictMode(setterValueOrProxy._4_4_,pSStack_38);
      }
    }
  }
  JavascriptError::ThrowCantAssignIfStrictMode(setterValueOrProxy._4_4_,pSStack_38);
  return 0;
}

Assistant:

BOOL JavascriptOperators::SetItemOnTaggedNumber(Var receiver, RecyclableObject* object, uint32 index, Var newValue, ScriptContext* requestContext,
        PropertyOperationFlags propertyOperationFlags)
    {
        Assert(TaggedNumber::Is(receiver));

        if (requestContext->optimizationOverrides.GetSideEffects() & SideEffects_Accessor)
        {
            Var setterValueOrProxy = nullptr;
            DescriptorFlags flags = None;
            if (object == nullptr)
            {
                GetPropertyObject(receiver, requestContext, &object);
            }
            if (JavascriptOperators::CheckPrototypesForAccessorOrNonWritableItem(object, index, &setterValueOrProxy, &flags, requestContext))
            {
                if ((flags & Accessor) == Accessor)
                {
                    if (JavascriptError::ThrowIfStrictModeUndefinedSetter(propertyOperationFlags, setterValueOrProxy, requestContext))
                    {
                        return TRUE;
                    }
                    if (setterValueOrProxy)
                    {
                        RecyclableObject* func = VarTo<RecyclableObject>(setterValueOrProxy);
                        JavascriptOperators::CallSetter(func, receiver, newValue, requestContext);
                        return TRUE;
                    }
                }
                else if ((flags & Proxy) == Proxy)
                {
                    Assert(VarIs<JavascriptProxy>(setterValueOrProxy));
                    JavascriptProxy* proxy = VarTo<JavascriptProxy>(setterValueOrProxy);
                    const PropertyRecord* propertyRecord = nullptr;
                    proxy->PropertyIdFromInt(index, &propertyRecord);
                    return proxy->SetPropertyTrap(receiver, JavascriptProxy::SetPropertyTrapKind::SetItemOnTaggedNumberKind, propertyRecord->GetPropertyId(), newValue, requestContext, propertyOperationFlags);
                }
                else
                {
                    Assert((flags & Data) == Data && (flags & Writable) == None);
                    JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags, requestContext);
                }
            }
        }

        JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags, requestContext);
        return FALSE;
    }